

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::setStyle(QWizardPrivate *this,QStyle *style)

{
  QWidget *this_00;
  QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
  *pQVar1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  int i;
  long lVar4;
  
  for (lVar4 = 0; lVar4 != 9; lVar4 = lVar4 + 1) {
    this_00 = *(QWidget **)((long)&this->field_20 + lVar4 * 8);
    if (this_00 != (QWidget *)0x0) {
      QWidget::setStyle(this_00,style);
    }
  }
  pQVar1 = (this->pageMap).d.d.ptr;
  p_Var2 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
                 *)0x0) {
    p_Var3 = (_Rb_tree_node_base *)0x0;
    p_Var2 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var3 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  for (; p_Var3 != p_Var2; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    QWidget::setStyle((QWidget *)p_Var3[1]._M_parent,style);
  }
  return;
}

Assistant:

void QWizardPrivate::setStyle(QStyle *style)
{
    for (int i = 0; i < QWizard::NButtons; i++)
        if (btns[i])
            btns[i]->setStyle(style);
    const PageMap::const_iterator pcend = pageMap.constEnd();
    for (PageMap::const_iterator it = pageMap.constBegin(); it != pcend; ++it)
        it.value()->setStyle(style);
}